

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapcache.cpp
# Opt level: O3

void __thiscall QPMCache::resizeKeyArray(QPMCache *this,int size)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int *piVar4;
  ulong uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  if ((size != 0) && (this->keyArraySize < size)) {
    piVar4 = (int *)realloc(this->keyArray,(long)size << 2);
    this->keyArray = piVar4;
    auVar3 = _DAT_00674850;
    auVar2 = _DAT_00674840;
    uVar1 = this->keyArraySize;
    if (uVar1 != size) {
      uVar6 = ~uVar1 + size;
      auVar7._0_8_ = (long)(int)uVar1;
      auVar7._8_4_ = uVar1;
      auVar7._12_4_ = (int)uVar1 >> 0x1f;
      lVar8 = auVar7._8_8_ + 1;
      auVar9._4_4_ = 0;
      auVar9._0_4_ = uVar6;
      auVar9._8_4_ = uVar6;
      auVar9._12_4_ = 0;
      uVar5 = 0;
      auVar9 = auVar9 ^ _DAT_00674850;
      do {
        auVar10._8_4_ = (int)uVar5;
        auVar10._0_8_ = uVar5;
        auVar10._12_4_ = (int)(uVar5 >> 0x20);
        auVar10 = (auVar10 | auVar2) ^ auVar3;
        if ((bool)(~(auVar10._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar10._0_4_ ||
                    auVar9._4_4_ < auVar10._4_4_) & 1)) {
          piVar4[(long)(int)uVar1 + uVar5] = (int)auVar7._0_8_ + 1;
        }
        if ((auVar10._12_4_ != auVar9._12_4_ || auVar10._8_4_ <= auVar9._8_4_) &&
            auVar10._12_4_ <= auVar9._12_4_) {
          piVar4[(long)(int)uVar1 + uVar5 + 1] = (int)lVar8 + 1;
        }
        uVar5 = uVar5 + 2;
        auVar7._0_8_ = auVar7._0_8_ + 2;
        lVar8 = lVar8 + 2;
      } while (((ulong)uVar6 + 2 & 0xfffffffffffffffe) != uVar5);
    }
    this->keyArraySize = size;
  }
  return;
}

Assistant:

void QPMCache::resizeKeyArray(int size)
{
    if (size <= keyArraySize || size == 0)
        return;
    keyArray = q_check_ptr(static_cast<int *>(realloc(keyArray,
                    size * sizeof(int))));
    for (int i = keyArraySize; i != size; ++i)
        keyArray[i] = i + 1;
    keyArraySize = size;
}